

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O2

void sfd_start_conn(sfd_listener *l,nni_aio *aio)

{
  int fd;
  int iVar1;
  nng_err result;
  nni_sfd_conn *in_RAX;
  long lVar2;
  nni_sfd_conn *local_28;
  nni_sfd_conn *c;
  
  iVar1 = l->listen_cnt;
  local_28 = in_RAX;
  if (iVar1 < 1) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sockfd.c",
              0x56,"l->listen_cnt > 0");
    iVar1 = l->listen_cnt;
  }
  fd = l->listen_q[0];
  for (lVar2 = 0x17; lVar2 + -0x16 < (long)iVar1; lVar2 = lVar2 + 1) {
    l->listen_q[lVar2 + -0x16] = l->listen_q[lVar2 + -0x15];
  }
  l->listen_cnt = iVar1 + -1;
  result = nni_sfd_conn_alloc(&local_28,fd);
  if (result == NNG_OK) {
    nni_aio_set_output(aio,0,local_28);
    nni_aio_finish(aio,NNG_OK,0);
  }
  else {
    nni_aio_finish_error(aio,result);
    nni_sfd_close_fd(fd);
  }
  return;
}

Assistant:

static void
sfd_start_conn(sfd_listener *l, nni_aio *aio)
{
	int           fd;
	int           rv;
	nni_sfd_conn *c;
	NNI_ASSERT(l->listen_cnt > 0);
	fd = l->listen_q[0];
	for (int i = 1; i < l->listen_cnt; i++) {
		l->listen_q[i] = l->listen_q[i + 1];
	}
	l->listen_cnt--;
	if ((rv = nni_sfd_conn_alloc(&c, fd)) != 0) {
		nni_aio_finish_error(aio, rv);
		nni_sfd_close_fd(fd);
	} else {
		nni_aio_set_output(aio, 0, c);
		nni_aio_finish(aio, 0, 0);
	}
}